

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::LineCase::LineCase
          (LineCase *this,Context *context,char *name,char *description,
          ColorlessLineData *linesBegin,ColorlessLineData *linesEnd,float lineWidth,
          WindowRectangle *viewport,int searchKernelSize)

{
  ColoredLineData *__a;
  ColoredLineData *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer pCVar6;
  ColoredLineData *pCVar7;
  ulong uVar8;
  ColoredLineData *__args;
  ColoredLineData *__args_00;
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  *this_00;
  long lVar9;
  pointer pCVar10;
  undefined1 local_78 [24];
  undefined1 *puStack_60;
  float local_58 [2];
  float afStack_50 [2];
  undefined1 *local_48;
  undefined1 *puStack_40;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.m_context = context;
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__LineRenderTestCase_00d358b8;
  (this->super_LineRenderTestCase).m_lineWidth = lineWidth;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (linesBegin == linesEnd) {
    __args = (pointer)0x0;
  }
  else {
    __args = (ColoredLineData *)0x0;
    do {
      local_78._0_8_ = *(undefined8 *)(linesBegin->p0).m_data;
      local_78._8_8_ = *(undefined8 *)((linesBegin->p0).m_data + 2);
      local_78._16_8_ = &DAT_3f8000003f800000;
      puStack_60 = &DAT_3f8000003f800000;
      local_58 = *(float (*) [2])(linesBegin->p1).m_data;
      afStack_50 = *(float (*) [2])((linesBegin->p1).m_data + 2);
      local_48 = &DAT_3f8000003f800000;
      puStack_40 = &DAT_3f8000003f800000;
      __a = (this->super_LineRenderTestCase).m_lines.
            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      pCVar1 = (this->super_LineRenderTestCase).m_lines.
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (__a == pCVar1) {
        lVar9 = (long)__a - (long)__args;
        if (lVar9 == 0x7fffffffffffffc0) {
          (this->super_LineRenderTestCase).m_lines.
          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
          ._M_impl.super__Vector_impl_data._M_start = __args;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar5 = lVar9 >> 6;
        uVar8 = uVar5;
        if (__a == __args) {
          uVar8 = 1;
        }
        this_00 = (_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                   *)(uVar8 + uVar5);
        if ((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
             *)0x1fffffffffffffe < this_00) {
          this_00 = (_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                     *)0x1ffffffffffffff;
        }
        if (CARRY8(uVar8,uVar5)) {
          this_00 = (_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                     *)0x1ffffffffffffff;
        }
        pCVar6 = std::
                 _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                 ::_M_allocate(this_00,0x1ffffffffffffff);
        std::
        allocator_traits<std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>>
        ::
        construct<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData_const&>
                  ((allocator_type *)(lVar9 + (long)pCVar6),(ColoredLineData *)local_78,__args_00);
        pCVar10 = pCVar6;
        for (pCVar7 = __args; __a != pCVar7; pCVar7 = pCVar7 + 1) {
          lVar9 = 0;
          do {
            (pCVar10->p0).m_data[lVar9] = (pCVar7->p0).m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          lVar9 = 4;
          do {
            (pCVar10->p0).m_data[lVar9] = (pCVar7->p0).m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 8);
          lVar9 = 8;
          do {
            (pCVar10->p0).m_data[lVar9] = (pCVar7->p0).m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0xc);
          lVar9 = 0xc;
          do {
            (pCVar10->p0).m_data[lVar9] = (pCVar7->p0).m_data[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x10);
          pCVar10 = pCVar10 + 1;
        }
        if (__args != (ColoredLineData *)0x0) {
          operator_delete(__args,(long)pCVar1 - (long)__args);
        }
        (this->super_LineRenderTestCase).m_lines.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar10 + 1;
        (this->super_LineRenderTestCase).m_lines.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar6 + (long)this_00;
        __args = pCVar6;
      }
      else {
        std::
        allocator_traits<std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>>
        ::
        construct<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData_const&>
                  ((allocator_type *)__a,(ColoredLineData *)local_78,__args);
        (this->super_LineRenderTestCase).m_lines.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
        ._M_impl.super__Vector_impl_data._M_finish = __a + 1;
      }
      linesBegin = linesBegin + 1;
    } while (linesBegin != linesEnd);
  }
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_start = __args;
  iVar2 = viewport->bottom;
  iVar3 = viewport->width;
  iVar4 = viewport->height;
  (this->super_LineRenderTestCase).m_viewport.left = viewport->left;
  (this->super_LineRenderTestCase).m_viewport.bottom = iVar2;
  (this->super_LineRenderTestCase).m_viewport.width = iVar3;
  (this->super_LineRenderTestCase).m_viewport.height = iVar4;
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__LineRenderTestCase_00d35840;
  this->m_searchKernelSize = searchKernelSize;
  return;
}

Assistant:

LineCase::LineCase (Context& context, const char* name, const char* description, const LineRenderTestCase::ColorlessLineData* linesBegin, const LineRenderTestCase::ColorlessLineData* linesEnd, float lineWidth, const rr::WindowRectangle& viewport, int searchKernelSize)
	: LineRenderTestCase	(context, name, description, linesBegin, linesEnd, lineWidth, viewport)
	, m_searchKernelSize	(searchKernelSize)
{
}